

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdft.c
# Opt level: O1

char * gdImageStringFT(gdImage *im,int *brect,int fg,char *fontlist,double ptsize,double angle,int x
                      ,int y,char *string)

{
  return "libgd was not built with FreeType font support\n";
}

Assistant:

BGD_DECLARE(char *) gdImageStringFT (gdImage * im, int *brect, int fg, const char *fontlist,
                                     double ptsize, double angle, int x, int y, const char *string)
{
	(void)im;
	(void)brect;
	(void)fg;
	(void)fontlist;
	(void)ptsize;
	(void)angle;
	(void)x;
	(void)y;
	(void)string;

	return "libgd was not built with FreeType font support\n";
}